

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O0

void __thiscall pmx::PmxMorphBoneOffset::PmxMorphBoneOffset(PmxMorphBoneOffset *this)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  PmxMorphBoneOffset *this_local;
  
  PmxMorphOffset::PmxMorphOffset(&this->super_PmxMorphOffset);
  (this->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_01018cc0;
  this->bone_index = 0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    this->translation[local_14] = 0.0;
  }
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    this->rotation[local_18] = 0.0;
  }
  return;
}

Assistant:

PmxMorphBoneOffset()
			: bone_index(0)
		{
			for (int i = 0; i < 3; ++i) {
				translation[i] = 0.0f;
			}
			for (int i = 0; i < 4; ++i) {
				rotation[i] = 0.0f;
			}
		}